

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O0

void __thiscall Js::ScriptFunction::InvalidateCachedScopeChain(ScriptFunction *this)

{
  FrameDisplay *this_00;
  uint16 uVar1;
  ActivationObjectEx **ppAVar2;
  ActivationObjectEx *this_01;
  FrameDisplay **ppFVar3;
  void *aValue;
  RecyclableObject *pRVar4;
  RecyclableObject *scopeObj;
  Var scope;
  uint i;
  uint length;
  FrameDisplay *pDisplay;
  ScriptFunction *this_local;
  
  ppAVar2 = Memory::WriteBarrierPtr::operator_cast_to_ActivationObjectEx__
                      ((WriteBarrierPtr *)&this->cachedScopeObj);
  if (*ppAVar2 != (ActivationObjectEx *)0x0) {
    this_01 = Memory::WriteBarrierPtr<Js::ActivationObjectEx>::operator->(&this->cachedScopeObj);
    ActivationObjectEx::InvalidateCachedScope(this_01);
  }
  ppFVar3 = Memory::WriteBarrierPtr::operator_cast_to_FrameDisplay__
                      ((WriteBarrierPtr *)&this->environment);
  this_00 = *ppFVar3;
  uVar1 = FrameDisplay::GetLength(this_00);
  for (scope._0_4_ = 0; (uint)scope < uVar1; scope._0_4_ = (uint)scope + 1) {
    aValue = FrameDisplay::GetItem(this_00,(uint)scope);
    pRVar4 = VarTo<Js::RecyclableObject>(aValue);
    (*(pRVar4->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
      [0x59])();
  }
  return;
}

Assistant:

void ScriptFunction::InvalidateCachedScopeChain()
    {
        // Note: Currently this helper assumes that we're in an eval-class case
        // where all the contents of the closure environment are dynamic objects.
        // Invalidating scopes that are raw slot arrays, etc., will have to be done
        // directly in byte code.

        // A function nested within this one has escaped.
        // Invalidate our own cached scope object, and walk the closure environment
        // doing this same.
        if (this->cachedScopeObj)
        {
            this->cachedScopeObj->InvalidateCachedScope();
        }
        FrameDisplay *pDisplay = this->environment;
        uint length = (uint)pDisplay->GetLength();
        for (uint i = 0; i < length; i++)
        {
            Var scope = pDisplay->GetItem(i);
            RecyclableObject *scopeObj = VarTo<RecyclableObject>(scope);
            scopeObj->InvalidateCachedScope();
        }
    }